

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::udp_tracker_connection::send_udp_announce(udp_tracker_connection *this)

{
  sha1_hash *this_00;
  peer_id *__last;
  listen_socket_handle *sock;
  ushort uVar1;
  session_settings *this_01;
  int iVar2;
  char *b;
  iterator iVar3;
  string *psVar4;
  error_code *peVar5;
  uint uVar6;
  error_code *in_R8;
  size_type sVar7;
  bool bVar8;
  string_view url;
  span<const_char> in;
  span<const_char> p;
  span<char> local_430;
  error_code ec;
  string request_string;
  shared_ptr<libtorrent::aux::request_callback> cb;
  address ip;
  char buf [800];
  
  if (this->m_abort == false) {
    local_430.m_ptr = buf;
    local_430.m_len = 800;
    bVar8 = (this->m_target).impl_.data_.base.sa_family != 2;
    if (bVar8) {
      ip.ipv6_address_.addr_.__in6_u._0_8_ =
           *(undefined8 *)((long)&(this->m_target).impl_.data_ + 8);
      ip.ipv6_address_.addr_.__in6_u._8_8_ =
           *(undefined8 *)((long)&(this->m_target).impl_.data_ + 0x10);
      ip.ipv6_address_.scope_id_ = (unsigned_long)(this->m_target).impl_.data_.v6.sin6_scope_id;
      ip.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
    }
    else {
      ip.ipv4_address_.addr_.s_addr = (in4_addr_type)(this->m_target).impl_.data_.v4.sin_addr.s_addr
      ;
      ip.ipv6_address_.addr_.__in6_u._0_8_ = 0;
      ip.ipv6_address_.addr_.__in6_u._8_8_ = 0;
      ip.ipv6_address_.scope_id_ = 0;
    }
    ip.type_ = (anon_enum_32)bVar8;
    this_01 = ((this->super_tracker_connection).m_man)->m_settings;
    iVar3 = ::std::
            _Rb_tree<boost::asio::ip::address,_std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>,_std::_Select1st<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
            ::find((_Rb_tree<boost::asio::ip::address,_std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>,_std::_Select1st<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>,_std::less<boost::asio::ip::address>,_std::allocator<std::pair<const_boost::asio::ip::address,_libtorrent::aux::udp_tracker_connection::connection_cache_entry>_>_>
                    *)m_connection_cache,&ip);
    if (iVar3._M_node != (_Base_ptr)(m_connection_cache + 8)) {
      write_impl<long,long,char>(*(long *)(iVar3._M_node + 2),&local_430);
      write_impl<int,libtorrent::aux::udp_tracker_connection::action_t,char>(announce,&local_430);
      write_impl<int,unsigned_int,char>(this->m_transaction_id,&local_430);
      this_00 = &(this->super_tracker_connection).m_req.info_hash;
      __last = &(this->super_tracker_connection).m_req.pid;
      ::std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char_const*,char*>((uchar *)this_00,(uchar *)__last,local_430.m_ptr);
      local_430.m_ptr = local_430.m_ptr + 0x14;
      local_430.m_len = local_430.m_len + -0x14;
      sock = &(this->super_tracker_connection).m_req.outgoing_socket;
      ::std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char_const*,char*>((uchar *)__last,(uchar *)sock,local_430.m_ptr);
      local_430.m_ptr = local_430.m_ptr + 0x14;
      local_430.m_len = local_430.m_len + -0x14;
      write_impl<long,long,char>((this->super_tracker_connection).m_req.downloaded,&local_430);
      write_impl<long,long,char>((this->super_tracker_connection).m_req.left,&local_430);
      write_impl<long,long,char>((this->super_tracker_connection).m_req.uploaded,&local_430);
      write_impl<int,libtorrent::event_t,char>
                ((this->super_tracker_connection).m_req.event,&local_430);
      bVar8 = session_settings::get_bool(this_01,0x8026);
      uVar6 = 0;
      if (!bVar8) {
        psVar4 = session_settings::get_str_abi_cxx11_(this_01,1);
        uVar6 = 0;
        if (psVar4->_M_string_length != 0) {
          request_string._M_dataplus._M_p = request_string._M_dataplus._M_p & 0xffffff0000000000;
          request_string._M_string_length =
               (size_type)&boost::system::detail::cat_holder<void>::system_category_instance;
          psVar4 = session_settings::get_str_abi_cxx11_(this_01,1);
          boost::asio::ip::make_address
                    (&ip,(psVar4->_M_dataplus)._M_p,(error_code *)&request_string);
          uVar6 = 0;
          if ((request_string._M_dataplus._M_p._4_1_ == '\0') && (ip.type_ == ipv4)) {
            boost::asio::ip::address::to_v4((address *)&ec);
            uVar6 = ec.val_;
          }
        }
      }
      write_impl<unsigned_int,unsigned_int,char>
                (uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18,
                 &local_430);
      write_impl<int,unsigned_int,char>((this->super_tracker_connection).m_req.key,&local_430);
      write_impl<int,int,char>((this->super_tracker_connection).m_req.num_want,&local_430);
      uVar1 = (this->super_tracker_connection).m_req.listen_port;
      *(ushort *)local_430.m_ptr = uVar1 << 8 | uVar1 >> 8;
      local_430.m_ptr = (char *)((long)local_430.m_ptr + 2);
      local_430.m_len = local_430.m_len + -2;
      request_string._M_dataplus._M_p = (pointer)&request_string.field_2;
      request_string._M_string_length = 0;
      request_string.field_2._M_local_buf[0] = '\0';
      ec.val_ = 0;
      ec.failed_ = false;
      ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                 super_error_category;
      url._M_str = (char *)&ec;
      url._M_len = (size_t)(this->super_tracker_connection).m_req.url._M_dataplus._M_p;
      peVar5 = &ec;
      parse_url_components_abi_cxx11_
                ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&ip,(aux *)(this->super_tracker_connection).m_req.url._M_string_length,url,in_R8
                );
      ::std::__cxx11::string::operator=((string *)&request_string,(string *)&ip);
      ::std::
      _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&ip);
      if (ec.failed_ == true) {
        request_string._M_string_length = 0;
        *request_string._M_dataplus._M_p = '\0';
      }
      if (request_string._M_string_length != 0) {
        sVar7 = 0xff;
        if (request_string._M_string_length < 0xff) {
          sVar7 = request_string._M_string_length;
        }
        ::std::__cxx11::string::resize((ulong)&request_string);
        *local_430.m_ptr = 2;
        *(char *)((long)local_430.m_ptr + 1) = (char)sVar7;
        local_430.m_ptr = (char *)((long)local_430.m_ptr + 2);
        local_430.m_len = local_430.m_len + -2;
        if (request_string._M_string_length == 0) {
          peVar5 = (error_code *)0x0;
        }
        else {
          memmove(local_430.m_ptr,request_string._M_dataplus._M_p,request_string._M_string_length);
          peVar5 = (error_code *)(long)(int)request_string._M_string_length;
        }
        local_430.m_ptr = (char *)((long)local_430.m_ptr + (long)peVar5);
        local_430.m_len = local_430.m_len - (long)peVar5;
      }
      tracker_connection::requester((tracker_connection *)&cb);
      if (cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        iVar2 = (*(cb.
                   super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_request_callback[6])();
        if ((char)iVar2 != '\0') {
          in.m_len = (difference_type)peVar5;
          in.m_ptr = (char *)0x14;
          to_hex_abi_cxx11_((string *)&ip,(aux *)this_00,in);
          (*(cb.super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_request_callback[7])
                    (cb.
                     super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,"==> UDP_TRACKER_ANNOUNCE [%s]",
                     CONCAT44(ip.ipv4_address_.addr_.s_addr,ip.type_));
          ::std::__cxx11::string::~string((string *)&ip);
        }
      }
      if ((this->m_hostname)._M_string_length == 0) {
        tracker_manager::send
                  ((this->super_tracker_connection).m_man,(int)sock,&this->m_target,(size_t)buf,
                   800 - (int)local_430.m_len);
      }
      else {
        uVar1 = (this->m_target).impl_.data_.v4.sin_port;
        p.m_len = 800 - local_430.m_len;
        p.m_ptr = buf;
        tracker_manager::send_hostname
                  ((this->super_tracker_connection).m_man,sock,(this->m_hostname)._M_dataplus._M_p,
                   (uint)(ushort)(uVar1 << 8 | uVar1 >> 8),p,&ec,(udp_send_flags_t)0x2);
      }
      this->m_state = announce;
      tracker_connection::sent_bytes(&this->super_tracker_connection,0x33c - (int)local_430.m_len);
      this->m_attempts = this->m_attempts + 1;
      if (ec.failed_ == true) {
        fail(this,&ec,sock_write,"",(seconds32)0x0,(seconds32)0x1e);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&cb.
                  super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::__cxx11::string::~string((string *)&request_string);
    }
  }
  return;
}

Assistant:

void udp_tracker_connection::send_udp_announce()
	{
		if (m_abort) return;

		char buf[800];
		span<char> out = buf;

		tracker_request const& req = tracker_req();
		aux::session_settings const& settings = m_man.settings();

		auto const i = m_connection_cache.find(m_target.address());
		// this isn't really supposed to happen
		TORRENT_ASSERT(i != m_connection_cache.end());
		if (i == m_connection_cache.end()) return;

		aux::write_int64(i->second.connection_id, out); // connection_id
		aux::write_int32(action_t::announce, out); // action (announce)
		aux::write_int32(m_transaction_id, out); // transaction_id
		std::copy(req.info_hash.begin(), req.info_hash.end(), out.data()); // info_hash
		out = out.subspan(20);
		std::copy(req.pid.begin(), req.pid.end(), out.data()); // peer_id
		out = out.subspan(20);
		aux::write_int64(req.downloaded, out); // downloaded
		aux::write_int64(req.left, out); // left
		aux::write_int64(req.uploaded, out); // uploaded
		aux::write_int32(req.event, out); // event
		// ip address
		address_v4 announce_ip;

		if (!settings.get_bool(settings_pack::anonymous_mode)
			&& !settings.get_str(settings_pack::announce_ip).empty())
		{
			error_code ec;
			address ip = make_address(settings.get_str(settings_pack::announce_ip).c_str(), ec);
			if (!ec && ip.is_v4()) announce_ip = ip.to_v4();
		}
		aux::write_uint32(announce_ip.to_uint(), out);
		aux::write_int32(req.key, out); // key
		aux::write_int32(req.num_want, out); // num_want
		aux::write_uint16(req.listen_port, out); // port

		std::string request_string;
		error_code ec;
		using std::ignore;
		std::tie(ignore, ignore, ignore, ignore, request_string)
			= parse_url_components(req.url, ec);
		if (ec) request_string.clear();

		if (!request_string.empty())
		{
			std::size_t str_len = std::min(request_string.size(), std::size_t(255));
			request_string.resize(str_len);

			aux::write_uint8(2, out);
			aux::write_uint8(str_len, out);
			aux::write_string(request_string, out);
		}

#ifndef TORRENT_DISABLE_LOGGING
		std::shared_ptr<request_callback> cb = requester();
		if (cb && cb->should_log())
		{
			cb->debug_log("==> UDP_TRACKER_ANNOUNCE [%s]", aux::to_hex(req.info_hash).c_str());
		}
#endif

		if (!m_hostname.empty())
		{
			m_man.send_hostname(bind_socket(), m_hostname.c_str()
				, m_target.port(), {buf, int(sizeof(buf)) - out.size()}, ec
				, udp_socket::tracker_connection);
		}
		else
		{
			m_man.send(bind_socket(), m_target, {buf, int(sizeof(buf)) - out.size()}, ec
				, udp_socket::tracker_connection);
		}
		m_state = action_t::announce;
		sent_bytes(int(sizeof(buf)) - int(out.size()) + 28); // assuming UDP/IP header
		++m_attempts;
		if (ec)
		{
			fail(ec, operation_t::sock_write);
			return;
		}
	}